

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O2

type jsoncons::
     encode_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *val,
               basic_ostream<char,_std::char_traits<char>_> *os,
               basic_json_encode_options<char> *options,indenting indent)

{
  undefined7 in_register_00000009;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> encoder;
  allocator<char> local_2c9;
  stream_sink<char> local_2c8;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> local_290;
  
  if ((int)CONCAT71(in_register_00000009,indent) == 0) {
    stream_sink<char>::stream_sink(&local_2c8,os);
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    basic_compact_json_encoder
              ((basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                *)&local_290,&local_2c8,options,&local_2c9);
    stream_sink<char>::~stream_sink(&local_2c8);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (val,&local_290.super_basic_json_visitor<char>);
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_compact_json_encoder
              ((basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                *)&local_290);
  }
  else {
    stream_sink<char>::stream_sink(&local_2c8,os);
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::basic_json_encoder
              (&local_290,&local_2c8,options,&local_2c9);
    stream_sink<char>::~stream_sink(&local_2c8);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (val,&local_290.super_basic_json_visitor<char>);
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_json_encoder(&local_290);
  }
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value>::type
    encode_json(const T& val, std::basic_ostream<CharT>& os, 
        const basic_json_encode_options<CharT>& options = basic_json_encode_options<CharT>(),
        indenting indent = indenting::no_indent)
    {
        if (indent == indenting::no_indent)
        {
            basic_compact_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
        else
        {
            basic_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
    }